

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O1

void __thiscall Map::Country::~Country(Country *this)

{
  string *psVar1;
  pointer pcVar2;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar3;
  pointer ppCVar4;
  
  if (this->cyID != (int *)0x0) {
    operator_delete(this->cyID,4);
  }
  psVar1 = this->cyName;
  if (psVar1 != (string *)0x0) {
    pcVar2 = (psVar1->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &psVar1->field_2) {
      operator_delete(pcVar2,(psVar1->field_2)._M_allocated_capacity + 1);
    }
    operator_delete(psVar1,0x20);
  }
  if (this->cyContinent != (int *)0x0) {
    operator_delete(this->cyContinent,4);
  }
  pvVar3 = this->pAdjCountries;
  if (pvVar3 != (vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)0x0) {
    ppCVar4 = (pvVar3->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (ppCVar4 != (pointer)0x0) {
      operator_delete(ppCVar4,(long)(pvVar3->
                                    super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>
                                    )._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)ppCVar4);
    }
    operator_delete(pvVar3,0x18);
  }
  if (this->pPlayerOwnerId != (int *)0x0) {
    operator_delete(this->pPlayerOwnerId,4);
  }
  if (this->pNumberOfTroops != (int *)0x0) {
    operator_delete(this->pNumberOfTroops,4);
    return;
  }
  return;
}

Assistant:

Map::Country::~Country() {
    delete cyID;
    delete cyName;
    delete cyContinent;
    delete pAdjCountries;
    delete pPlayerOwnerId;
    delete pNumberOfTroops;
}